

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcd.c
# Opt level: O0

void opj_tcd_free_tile(opj_tcd_t *p_tcd)

{
  uint uVar1;
  uint uVar2;
  opj_tcd_tile_t *poVar3;
  long lVar4;
  code *local_58;
  _func_void_opj_tcd_precinct_t_ptr *l_tcd_code_block_deallocate;
  OPJ_UINT32 l_nb_precincts;
  OPJ_UINT32 l_nb_resolutions;
  opj_tcd_precinct_t *l_precinct;
  opj_tcd_band_t *l_band;
  opj_tcd_resolution_t *l_res;
  opj_tcd_tilecomp_t *l_tile_comp;
  opj_tcd_tile_t *l_tile;
  OPJ_UINT32 precno;
  OPJ_UINT32 bandno;
  OPJ_UINT32 resno;
  OPJ_UINT32 compno;
  opj_tcd_t *p_tcd_local;
  
  if ((p_tcd != (opj_tcd_t *)0x0) && (p_tcd->tcd_image != (opj_tcd_image_t *)0x0)) {
    if ((p_tcd->field_0x3c & 1) == 0) {
      local_58 = opj_tcd_code_block_enc_deallocate;
    }
    else {
      local_58 = opj_tcd_code_block_dec_deallocate;
    }
    poVar3 = p_tcd->tcd_image->tiles;
    if (poVar3 != (opj_tcd_tile_t *)0x0) {
      l_res = (opj_tcd_resolution_t *)poVar3->comps;
      for (bandno = 0; bandno < poVar3->numcomps; bandno = bandno + 1) {
        l_band = *(opj_tcd_band_t **)&l_res->numbands;
        if (l_band != (opj_tcd_band_t *)0x0) {
          uVar1 = l_res->bands[0].x0;
          for (precno = 0; precno < SUB164(ZEXT416(uVar1) / ZEXT816(0xb0),0); precno = precno + 1) {
            l_precinct = (opj_tcd_precinct_t *)&l_band->precincts_data_size;
            for (l_tile._4_4_ = 0; l_tile._4_4_ < 3; l_tile._4_4_ = l_tile._4_4_ + 1) {
              _l_nb_precincts = (l_precinct->cblks).enc;
              if (_l_nb_precincts != (opj_tcd_cblk_enc_t *)0x0) {
                uVar2 = l_precinct->block_size;
                for (l_tile._0_4_ = 0; (uint)l_tile < SUB164(ZEXT416(uVar2) / ZEXT816(0x38),0);
                    l_tile._0_4_ = (uint)l_tile + 1) {
                  opj_tgt_destroy(*(opj_tgt_tree_t **)&_l_nb_precincts->numbps);
                  _l_nb_precincts->numbps = 0;
                  _l_nb_precincts->numlenbits = 0;
                  opj_tgt_destroy(*(opj_tgt_tree_t **)&_l_nb_precincts->data_size);
                  _l_nb_precincts->data_size = 0;
                  _l_nb_precincts->numpasses = 0;
                  (*local_58)(_l_nb_precincts);
                  _l_nb_precincts = (opj_tcd_cblk_enc_t *)&_l_nb_precincts->numpassesinlayers;
                }
                opj_free((l_precinct->cblks).blocks);
                (l_precinct->cblks).enc = (opj_tcd_cblk_enc_t *)0x0;
              }
              l_precinct = (opj_tcd_precinct_t *)&l_precinct->imsbtree;
            }
            l_band = (opj_tcd_band_t *)&l_band[3].precincts_data_size;
          }
          opj_free(*(void **)&l_res->numbands);
          *(undefined8 *)&l_res->numbands = 0;
        }
        if ((l_res->bands[0].bandno != 0) &&
           (lVar4._0_4_ = l_res->bands[0].x1, lVar4._4_4_ = l_res->bands[0].y1, lVar4 != 0)) {
          opj_aligned_free(*(void **)&l_res->bands[0].x1);
          l_res->bands[0].x1 = 0;
          l_res->bands[0].y1 = 0;
          l_res->bands[0].bandno = 0;
          *(undefined4 *)&l_res->bands[0].precincts = 0;
          *(undefined4 *)&l_res->bands[0].field_0x14 = 0;
        }
        l_res = (opj_tcd_resolution_t *)&l_res->bands[0].precincts_data_size;
      }
      opj_free(poVar3->comps);
      poVar3->comps = (opj_tcd_tilecomp_t *)0x0;
      opj_free(p_tcd->tcd_image->tiles);
      p_tcd->tcd_image->tiles = (opj_tcd_tile_t *)0x0;
    }
  }
  return;
}

Assistant:

static void opj_tcd_free_tile(opj_tcd_t *p_tcd)
{
        OPJ_UINT32 compno, resno, bandno, precno;
        opj_tcd_tile_t *l_tile = 00;
        opj_tcd_tilecomp_t *l_tile_comp = 00;
        opj_tcd_resolution_t *l_res = 00;
        opj_tcd_band_t *l_band = 00;
        opj_tcd_precinct_t *l_precinct = 00;
        OPJ_UINT32 l_nb_resolutions, l_nb_precincts;
        void (* l_tcd_code_block_deallocate) (opj_tcd_precinct_t *) = 00;

        if (! p_tcd) {
                return;
        }

        if (! p_tcd->tcd_image) {
                return;
        }

        if (p_tcd->m_is_decoder) {
                l_tcd_code_block_deallocate = opj_tcd_code_block_dec_deallocate;
        }
        else {
                l_tcd_code_block_deallocate = opj_tcd_code_block_enc_deallocate;
        }

        l_tile = p_tcd->tcd_image->tiles;
        if (! l_tile) {
                return;
        }

        l_tile_comp = l_tile->comps;

        for (compno = 0; compno < l_tile->numcomps; ++compno) {
                l_res = l_tile_comp->resolutions;
                if (l_res) {

                        l_nb_resolutions = l_tile_comp->resolutions_size / sizeof(opj_tcd_resolution_t);
                        for (resno = 0; resno < l_nb_resolutions; ++resno) {
                                l_band = l_res->bands;
                                for     (bandno = 0; bandno < 3; ++bandno) {
                                        l_precinct = l_band->precincts;
                                        if (l_precinct) {

                                                l_nb_precincts = l_band->precincts_data_size / sizeof(opj_tcd_precinct_t);
                                                for (precno = 0; precno < l_nb_precincts; ++precno) {
                                                        opj_tgt_destroy(l_precinct->incltree);
                                                        l_precinct->incltree = 00;
                                                        opj_tgt_destroy(l_precinct->imsbtree);
                                                        l_precinct->imsbtree = 00;
                                                        (*l_tcd_code_block_deallocate) (l_precinct);
                                                        ++l_precinct;
                                                }

                                                opj_free(l_band->precincts);
                                                l_band->precincts = 00;
                                        }
                                        ++l_band;
                                } /* for (resno */
                                ++l_res;
                        }

                        opj_free(l_tile_comp->resolutions);
                        l_tile_comp->resolutions = 00;
                }

                if (l_tile_comp->ownsData && l_tile_comp->data) {
                        opj_aligned_free(l_tile_comp->data);
                        l_tile_comp->data = 00;
                        l_tile_comp->ownsData = 0;
                        l_tile_comp->data_size = 0;
                        l_tile_comp->data_size_needed = 0;
                }
                ++l_tile_comp;
        }

        opj_free(l_tile->comps);
        l_tile->comps = 00;
        opj_free(p_tcd->tcd_image->tiles);
        p_tcd->tcd_image->tiles = 00;
}